

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addMemoryFuncs(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Ref left;
  size_t sVar1;
  bool bVar2;
  Ref *this_00;
  Value *pVVar3;
  Ref RVar4;
  reference pvVar5;
  pointer pMVar6;
  address64_t aVar7;
  address64_t aVar8;
  ValueBuilder *pVVar9;
  char *extraout_RDX;
  Ref in_R8;
  IString name;
  IString name_00;
  IString key;
  IString op;
  IString local_80;
  ValueBuilder *local_70;
  size_t local_68;
  Value *local_60;
  Value *local_58;
  Value *local_50;
  Value *local_48;
  Value *local_40;
  ValueBuilder *local_38;
  size_t local_30;
  Ref local_28;
  Ref memorySizeFunc;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  local_38 = WASM_MEMORY_SIZE;
  local_30 = _getKind;
  name.str._M_str = (char *)wasm;
  name.str._M_len = _getKind;
  memorySizeFunc.inst = (Value *)wasm;
  this_local = (Wasm2JSBuilder *)ast.inst;
  local_28 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_SIZE,name);
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar3 = cashew::Ref::operator->(this_00);
  local_70 = BUFFER;
  local_68 = _operator_;
  name_00.str._M_str = extraout_RDX;
  name_00.str._M_len = _operator_;
  pVVar9 = BUFFER;
  local_60 = (Value *)cashew::ValueBuilder::makeName(BUFFER,name_00);
  IString::IString(&local_80,"byteLength");
  key.str._M_str = (char *)pVVar9;
  key.str._M_len = (size_t)local_80.str._M_str;
  local_58 = (Value *)cashew::ValueBuilder::makeDot
                                ((ValueBuilder *)local_60,(Ref)local_80.str._M_len,key);
  sVar1 = _operator<<;
  left.inst = cashew::DIV.inst;
  RVar4 = cashew::ValueBuilder::makeInt(0x10000);
  op.str._M_str = (char *)RVar4.inst;
  op.str._M_len = sVar1;
  local_50 = (Value *)cashew::ValueBuilder::makeBinary((ValueBuilder *)local_58,left,op,in_R8);
  local_48 = (Value *)makeJsCoercion((Ref)local_50,JS_INT);
  local_40 = (Value *)cashew::ValueBuilder::makeReturn((Ref)local_48);
  cashew::Value::push_back(pVVar3,(Ref)local_40);
  pVVar3 = cashew::Ref::operator->((Ref *)&this_local);
  cashew::Value::push_back(pVVar3,local_28);
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)(memorySizeFunc.inst + 5));
  if (!bVar2) {
    pvVar5 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(memorySizeFunc.inst + 5),0);
    pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar5);
    aVar7 = Address::operator_cast_to_unsigned_long(&pMVar6->max);
    pvVar5 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(memorySizeFunc.inst + 5),0);
    pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar5);
    aVar8 = Address::operator_cast_to_unsigned_long(&pMVar6->initial);
    if (aVar8 < aVar7) {
      addMemoryGrowFunc(this,(Ref)this_local,(Module *)memorySizeFunc.inst);
    }
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryFuncs(Ref ast, Module* wasm) {
  Ref memorySizeFunc = ValueBuilder::makeFunction(WASM_MEMORY_SIZE);
  memorySizeFunc[3]->push_back(ValueBuilder::makeReturn(
    makeJsCoercion(ValueBuilder::makeBinary(
                     ValueBuilder::makeDot(ValueBuilder::makeName(BUFFER),
                                           IString("byteLength")),
                     DIV,
                     ValueBuilder::makeInt(Memory::kPageSize)),
                   JsType::JS_INT)));
  ast->push_back(memorySizeFunc);

  if (!wasm->memories.empty() &&
      wasm->memories[0]->max > wasm->memories[0]->initial) {
    addMemoryGrowFunc(ast, wasm);
  }
}